

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void do_ssi_include(mg_connection *nc,char *ssi,char *tag,int include_level,mg_serve_http_opts *opts
                   )

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *fp;
  char *p;
  char path [500];
  undefined1 local_2038 [8];
  char file_name [8192];
  mg_serve_http_opts *opts_local;
  int include_level_local;
  char *tag_local;
  char *ssi_local;
  mg_connection *nc_local;
  
  iVar1 = __isoc99_sscanf(tag," virtual=\"%[^\"]\"",local_2038);
  if (iVar1 == 1) {
    snprintf((char *)&p,500,"%s/%s",opts->document_root,local_2038);
  }
  else {
    iVar1 = __isoc99_sscanf(tag," abspath=\"%[^\"]\"",local_2038);
    if (iVar1 == 1) {
      snprintf((char *)&p,500,"%s",local_2038);
    }
    else {
      iVar1 = __isoc99_sscanf(tag," file=\"%[^\"]\"",local_2038);
      if ((iVar1 != 1) && (iVar1 = __isoc99_sscanf(tag," \"%[^\"]\"",local_2038), iVar1 != 1)) {
        mg_printf(nc,"Bad SSI #include: [%s]",tag);
        return;
      }
      snprintf((char *)&p,500,"%s",ssi);
      pcVar4 = strrchr((char *)&p,0x2f);
      if (pcVar4 != (char *)0x0) {
        pcVar4[1] = '\0';
      }
      sVar5 = strlen((char *)&p);
      sVar2 = strlen((char *)&p);
      snprintf(path + (sVar5 - 8),500 - sVar2,"%s",local_2038);
    }
  }
  __stream = fopen64((char *)&p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    mg_printf(nc,"SSI include error: fopen(%s): %s",&p,pcVar4);
  }
  else {
    iVar1 = fileno(__stream);
    mg_set_close_on_exec(iVar1);
    pcVar4 = opts->ssi_pattern;
    sVar5 = strlen(opts->ssi_pattern);
    iVar1 = mg_match_prefix(pcVar4,(int)sVar5,(char *)&p);
    if (iVar1 < 1) {
      send_file_data(nc,(FILE *)__stream);
    }
    else {
      send_ssi_file(nc,(char *)&p,(FILE *)__stream,include_level + 1,opts);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

static void do_ssi_include(struct mg_connection *nc, const char *ssi, char *tag,
                           int include_level,
                           const struct mg_serve_http_opts *opts) {
    char file_name[BUFSIZ], path[MAX_PATH_SIZE], *p;
    FILE *fp;

    /*
   * sscanf() is safe here, since send_ssi_file() also uses buffer
   * of size MG_BUF_LEN to get the tag. So strlen(tag) is always < MG_BUF_LEN.
   */
    if (sscanf(tag, " virtual=\"%[^\"]\"", file_name) == 1) {
        /* File name is relative to the webserver root */
        snprintf(path, sizeof(path), "%s/%s", opts->document_root, file_name);
    } else if (sscanf(tag, " abspath=\"%[^\"]\"", file_name) == 1) {
        /*
     * File name is relative to the webserver working directory
     * or it is absolute system path
     */
        snprintf(path, sizeof(path), "%s", file_name);
    } else if (sscanf(tag, " file=\"%[^\"]\"", file_name) == 1 ||
               sscanf(tag, " \"%[^\"]\"", file_name) == 1) {
        /* File name is relative to the currect document */
        snprintf(path, sizeof(path), "%s", ssi);
        if ((p = strrchr(path, '/')) != NULL) {
            p[1] = '\0';
        }
        snprintf(path + strlen(path), sizeof(path) - strlen(path), "%s", file_name);
    } else {
        mg_printf(nc, "Bad SSI #include: [%s]", tag);
        return;
    }

    if ((fp = fopen(path, "rb")) == NULL) {
        mg_printf(nc, "SSI include error: fopen(%s): %s", path, strerror(errno));
    } else {
        mg_set_close_on_exec(fileno(fp));
        if (mg_match_prefix(opts->ssi_pattern, strlen(opts->ssi_pattern), path) >
            0) {
            send_ssi_file(nc, path, fp, include_level + 1, opts);
        } else {
            send_file_data(nc, fp);
        }
        fclose(fp);
    }
}